

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void DitherRow(VP8Decoder *dec)

{
  long in_RDI;
  uint8_t *v_dst;
  uint8_t *u_dst;
  int uv_bps;
  int cache_id;
  VP8MBData *data;
  VP8ThreadContext *ctx;
  int mb_x;
  undefined4 local_c;
  
  for (local_c = *(int *)(in_RDI + 0x1a0); local_c < *(int *)(in_RDI + 0x1a8); local_c = local_c + 1
      ) {
    if (3 < *(byte *)(*(long *)(in_RDI + 0xf0) + (long)local_c * 800 + 0x31c)) {
      Dither8x8((VP8Random *)ctx,(uint8_t *)data,cache_id,uv_bps);
      Dither8x8((VP8Random *)ctx,(uint8_t *)data,cache_id,uv_bps);
    }
  }
  return;
}

Assistant:

static void DitherRow(VP8Decoder* const dec) {
  int mb_x;
  assert(dec->dither);
  for (mb_x = dec->tl_mb_x; mb_x < dec->br_mb_x; ++mb_x) {
    const VP8ThreadContext* const ctx = &dec->thread_ctx;
    const VP8MBData* const data = ctx->mb_data + mb_x;
    const int cache_id = ctx->id;
    const int uv_bps = dec->cache_uv_stride;
    if (data->dither >= MIN_DITHER_AMP) {
      uint8_t* const u_dst = dec->cache_u + cache_id * 8 * uv_bps + mb_x * 8;
      uint8_t* const v_dst = dec->cache_v + cache_id * 8 * uv_bps + mb_x * 8;
      Dither8x8(&dec->dithering_rg, u_dst, uv_bps, data->dither);
      Dither8x8(&dec->dithering_rg, v_dst, uv_bps, data->dither);
    }
  }
}